

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O1

int xmlBufferAddHead(xmlBufferPtr buf,xmlChar *str,int len)

{
  xmlChar *__src;
  int iVar1;
  uint uVar2;
  
  iVar1 = 0x73;
  if (str != (xmlChar *)0x0 && buf != (xmlBufferPtr)0x0) {
    if (len < 0) {
      len = xmlStrlen(str);
    }
    iVar1 = 0;
    if (len != 0) {
      if (buf->alloc == XML_BUFFER_ALLOC_IO) {
        __src = buf->content;
        uVar2 = (int)__src - (int)buf->contentIO;
        if ((uint)len <= uVar2) {
          buf->content = __src + -(long)len;
          memmove(__src + -(long)len,str,(long)len);
          buf->use = buf->use + len;
          buf->size = buf->size + len;
          return 0;
        }
        if ((uint)len < (buf->size + uVar2) - buf->use) {
          memmove(buf->contentIO + len,__src,(ulong)(buf->use + 1));
          memmove(buf->contentIO,str,(long)len);
          buf->content = buf->contentIO;
          buf->use = buf->use + len;
          buf->size = buf->size + uVar2;
          return 0;
        }
      }
      if ((buf->size - buf->use <= (uint)len) && (iVar1 = xmlBufferGrow(buf,len), iVar1 < 0)) {
        return -1;
      }
      memmove(buf->content + len,buf->content,(ulong)(buf->use + 1));
      memmove(buf->content,str,(long)len);
      buf->use = buf->use + len;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
xmlBufferAddHead(xmlBufferPtr buf, const xmlChar *str, int len) {
    unsigned start = 0;

    if ((buf == NULL) || (str == NULL))
	return(XML_ERR_ARGUMENT);
    if (len < 0)
        len = xmlStrlen(str);
    if (len == 0)
        return(XML_ERR_OK);

    if (buf->alloc == XML_BUFFER_ALLOC_IO) {
        start = buf->content - buf->contentIO;

        /*
         * We can add it in the space previously shrunk
         */
        if ((unsigned) len <= start) {
            buf->content -= len;
            memmove(&buf->content[0], str, len);
            buf->use += len;
            buf->size += len;
            return(0);
        }
        if ((unsigned) len < buf->size + start - buf->use) {
            memmove(&buf->contentIO[len], buf->content, buf->use + 1);
            memmove(buf->contentIO, str, len);
            buf->content = buf->contentIO;
            buf->use += len;
            buf->size += start;
            return(0);
        }
    }

    if ((unsigned) len >= buf->size - buf->use) {
        if (xmlBufferGrow(buf, len) < 0)
            return(-1);
    }

    memmove(&buf->content[len], buf->content, buf->use + 1);
    memmove(buf->content, str, len);
    buf->use += len;
    return (0);
}